

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

float_t __thiscall djb::tab::qf2(tab *this,float_t u,float_t qf1,vec3 *wi)

{
  int iVar1;
  float_t fVar2;
  double dVar3;
  int local_38;
  float local_34;
  int32_t level;
  float_t delta;
  float_t u2;
  float_t epsilon;
  vec3 *wi_local;
  float_t qf1_local;
  float_t u_local;
  tab *this_local;
  
  level = 0;
  wi_local._0_4_ = qf1;
  wi_local._4_4_ = u;
  _qf1_local = this;
  local_34 = sat<float>((float *)((long)&wi_local + 4));
  local_38 = 0;
  if (local_34 < 1.0) {
    for (; dVar3 = std::fabs((double)(ulong)(uint)local_34),
        0.0001 < SUB84(dVar3,0) && local_38 < 0x1e; local_38 = local_38 + 1) {
      iVar1 = sgn<float>(local_34);
      local_34 = wi_local._4_4_;
      level = (int32_t)((float)iVar1 / (float)(2 << ((byte)local_38 & 0x1f)) + (float)level);
      fVar2 = cdf2(this,(float_t)level,wi_local._0_4_,wi);
      local_34 = local_34 - fVar2;
    }
    this_local._4_4_ = (float_t)level;
  }
  else {
    this_local._4_4_ = 1.0;
  }
  return this_local._4_4_;
}

Assistant:

float_t tab::qf2(float_t u, float_t qf1, const vec3 &wi) const
{
	const float_t epsilon = 1e-4;
	float_t u2 = 0, delta = sat(u);
	int32_t level = 0;

	if (delta >= 1) return 1;

	while (fabs(delta) > epsilon && level < 30) {
		u2+= (float_t)sgn(delta) / (2 << level);
		delta = u - cdf2(u2, qf1, wi);
		++level;
	}

	return u2;
}